

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O3

bool output_buffer(DESCRIPTOR_DATA *d)

{
  byte bVar1;
  short sVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  bool bVar8;
  size_t sVar9;
  int iVar10;
  bool bVar11;
  bool bVar12;
  char *__s;
  bool bVar13;
  char *pcVar14;
  char *pcVar15;
  char buf2 [128];
  char buf [4608];
  bool local_12ce;
  bool local_12cd;
  int local_12cc;
  int local_12c0;
  undefined4 local_12b8;
  char local_1238 [4616];
  
  if (d == (DESCRIPTOR_DATA *)0x0) {
    return false;
  }
  __s = local_1238;
  memset(__s,0,0x1200);
  cVar7 = *d->outbuf;
  if (cVar7 != '\0') {
    __s = local_1238;
    local_12cc = 7;
    local_12c0 = 7;
    bVar11 = false;
    local_12cd = false;
    local_12ce = false;
    pcVar15 = d->outbuf;
    bVar8 = false;
    bVar4 = false;
    do {
      pcVar14 = pcVar15 + 2;
      while( true ) {
        if ((long)d->outtop <= (long)pcVar15 - (long)d->outbuf) goto LAB_00279333;
        if (0x11df < (int)__s - (int)local_1238) {
          *__s = '\0';
          sVar2 = d->descriptor;
          sVar9 = strlen(local_1238);
          bVar6 = write_to_descriptor((int)sVar2,local_1238,(int)sVar9);
          if (!bVar6) {
            __s[1] = '\0';
            bVar8 = false;
            goto LAB_00279359;
          }
          memset(local_1238,0,0x1200);
          cVar7 = pcVar14[-2];
          __s = local_1238;
        }
        if (cVar7 == '{') break;
        *__s = cVar7;
        __s = __s + 1;
        cVar7 = pcVar14[-1];
        pcVar14 = pcVar14 + 1;
        pcVar15 = pcVar15 + 1;
        bVar11 = false;
        if (cVar7 == '\0') goto LAB_00279333;
      }
      bVar1 = pcVar14[-1];
      iVar3 = local_12cc;
      bVar6 = local_12ce;
      bVar5 = local_12cd;
      if ((!bVar11) &&
         (iVar10 = local_12cc, iVar3 = local_12c0, bVar6 = bVar8, bVar12 = local_12ce, bVar5 = bVar4
         , bVar13 = local_12cd, bVar1 == 0x3c)) goto LAB_002791c4;
      local_12cd = bVar5;
      local_12ce = bVar6;
      iVar10 = local_12c0;
      local_12cc = iVar3;
      bVar12 = bVar8;
      bVar13 = bVar4;
      if (0x61 < bVar1) {
        if (bVar1 < 0x6e) {
          if (bVar1 == 0x62) {
            bVar13 = false;
          }
          else {
            if (bVar1 != 0x66) goto switchD_002790d7_caseD_2e;
            bVar12 = false;
          }
          goto LAB_002791c4;
        }
        if (bVar1 == 0x6e) {
          if ((d->character == (CHAR_DATA *)0x0) || (bVar8 = is_ansi(d->character), !bVar8)) {
            local_12b8 = local_12b8 & 0xffffff00;
          }
          else {
            local_12b8 = 0x6d5b1b;
          }
          local_12c0 = 7;
          bVar12 = false;
          bVar13 = false;
        }
        else {
          if (bVar1 != 0x78) goto switchD_002790d7_caseD_2e;
          local_12b8 = CONCAT22(local_12b8._2_2_,0x7b);
        }
        goto LAB_00279274;
      }
      switch(bVar1) {
      case 0x2d:
        local_12b8 = CONCAT22(local_12b8._2_2_,0x7e);
        goto LAB_00279274;
      default:
switchD_002790d7_caseD_2e:
        sprintf((char *)&local_12b8,"{%c");
        goto LAB_00279274;
      case 0x30:
        iVar10 = 0;
        break;
      case 0x31:
        iVar10 = 1;
        break;
      case 0x32:
        iVar10 = 2;
        break;
      case 0x33:
        iVar10 = 3;
        break;
      case 0x34:
        iVar10 = 4;
        break;
      case 0x35:
        iVar10 = 5;
        break;
      case 0x36:
        iVar10 = 6;
        break;
      case 0x37:
        iVar10 = 7;
        break;
      case 0x3c:
        iVar10 = iVar3;
        bVar12 = local_12ce;
        bVar13 = local_12cd;
        break;
      case 0x42:
        bVar13 = true;
        break;
      case 0x46:
        bVar12 = true;
      }
LAB_002791c4:
      local_12c0 = iVar10;
      if ((d->character == (CHAR_DATA *)0x0) || (bVar8 = is_ansi(d->character), !bVar8)) {
        local_12b8 = local_12b8 & 0xffffff00;
      }
      else {
        pcVar15 = color_value_string(iVar10,bVar13,bVar12);
        strcpy((char *)&local_12b8,pcVar15);
      }
LAB_00279274:
      *__s = (char)local_12b8;
      if ((char)local_12b8 != '\0') {
        pcVar15 = (char *)((long)&local_12b8 + 1);
        do {
          cVar7 = *pcVar15;
          __s[1] = cVar7;
          __s = __s + 1;
          pcVar15 = pcVar15 + 1;
        } while (cVar7 != '\0');
      }
      cVar7 = *pcVar14;
      bVar11 = true;
      pcVar15 = pcVar14;
      bVar8 = bVar12;
      bVar4 = bVar13;
    } while (cVar7 != '\0');
  }
LAB_00279333:
  *__s = '\0';
  sVar2 = d->descriptor;
  sVar9 = strlen(local_1238);
  bVar8 = write_to_descriptor((int)sVar2,local_1238,(int)sVar9);
LAB_00279359:
  d->outtop = 0;
  return bVar8;
}

Assistant:

bool output_buffer(DESCRIPTOR_DATA *d)
{
	char buf[MAX_STRING_LENGTH];
	char buf2[128];
	const char *str;
	char *i;
	char *point;
	bool flash= false, o_flash, bold= false, o_bold;
	bool act= false, ok = true, color_code= false;
	int color = 7, o_color;

	/* discard nullptr descriptor */
	if (d == nullptr)
		return false;

	memset(buf, '\0', MAX_STRING_LENGTH);
	point = buf;
	str = d->outbuf;
	o_color = color;
	o_bold = bold;
	o_flash = flash;

	while (*str != '\0' && (str - d->outbuf) < d->outtop)
	{
		if ((int)(point - buf) >= MAX_STRING_LENGTH - 32)
		{
			/* buffer is full, so send it through the socket */
			*point++ = '\0';

			if (!(ok = write_to_descriptor(d->descriptor, buf, strlen(buf))))
				break;

			memset(buf, '\0', MAX_STRING_LENGTH);
			point = buf;
		}

		if (*str != '{')
		{
			color_code= false;
			*point++ = *str++;
			continue;
		}

		if (!color_code && *(str + 1) != '<')
		{
			o_color = color;
			o_bold = bold;
			o_flash = flash;
		}

		color_code = true;
		act= false;
		str++;

		switch (*str)
		{
			case 'x':
				sprintf(buf2, "{");
				break;
			case '-':
				sprintf(buf2, "~");
				break;
			case '<':
				color = o_color;
				bold = o_bold;
				flash = o_flash;
				act = true;
				break;
			case '0':
				color = 0;
				act = true;
				break;
			case '1':
				color = 1;
				act = true;
				break;
			case '2':
				color = 2;
				act = true;
				break;
			case '3':
				color = 3;
				act = true;
				break;
			case '4':
				color = 4;
				act = true;
				break;
			case '5':
				color = 5;
				act = true;
				break;
			case '6':
				color = 6;
				act = true;
				break;
			case '7':
				color = 7;
				act = true;
				break;
			case 'B':
				bold = true;
				act = true;
				break;
			case 'b':
				bold= false;
				act = true;
				break;
			case 'F':
				flash = true;
				act = true;
				break;
			case 'f':
				flash= false;
				act = true;
				break;
			case 'n':
				if (d->character && is_ansi(d->character))
					sprintf(buf2, "%s", ANSI_NORMAL);
				else
					buf2[0] = '\0';

				bold= false;
				color = 7;
				flash= false;
				break;
			default:
				sprintf(buf2, "{%c", *str);
				break;
		}

		if (act)
		{
			if (d->character && is_ansi(d->character))
			{
				sprintf(buf2, "%s", color_value_string(color, bold, flash));
				color_code = true;
			}
			else
			{
				buf2[0] = '\0';
			}
		}

		i = buf2;
		str++;
		while ((*point = *i) != '\0')
		{
			++point, ++i;
		}
	}

	*point++ = '\0';
	ok = ok && (write_to_descriptor(d->descriptor, buf, strlen(buf)));
	d->outtop = 0;

	return ok;
}